

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_compute_ttf_font_glyph_metrics
               (rf_ttf_font_info *font_info,int *codepoints,rf_int codepoints_count,
               rf_glyph_info *dst,rf_int dst_count)

{
  int iVar1;
  long lVar2;
  long *in_FS_OFFSET;
  int local_68;
  int char_size;
  int end_y;
  int end_x;
  int begin_y;
  int begin_x;
  stbtt_fontinfo *stbtt_ctx;
  rf_int i;
  undefined8 uStack_40;
  float required_area;
  undefined8 local_38;
  rf_int local_30;
  rf_int dst_count_local;
  rf_glyph_info *dst_local;
  rf_int codepoints_count_local;
  int *codepoints_local;
  rf_ttf_font_info *font_info_local;
  
  if ((((font_info != (rf_ttf_font_info *)0x0) && ((font_info->valid & 1U) != 0)) &&
      (dst != (rf_glyph_info *)0x0)) && (codepoints_count <= dst_count)) {
    lVar2 = *in_FS_OFFSET;
    uStack_40 = 0;
    local_38 = 0;
    *(undefined8 *)(lVar2 + -0x440) = 0;
    *(undefined8 *)(lVar2 + -0x438) = 0;
    font_info->largest_glyph_size = 0;
    i._4_4_ = 0;
    local_30 = dst_count;
    dst_count_local = (rf_int)dst;
    dst_local = (rf_glyph_info *)codepoints_count;
    codepoints_count_local = (rf_int)codepoints;
    codepoints_local = (int *)font_info;
    for (stbtt_ctx = (stbtt_fontinfo *)0x0; (long)stbtt_ctx < (long)dst_local;
        stbtt_ctx = (stbtt_fontinfo *)((long)&stbtt_ctx->userdata + 1)) {
      _begin_y = (stbtt_fontinfo *)(codepoints_local + 8);
      *(undefined4 *)(dst_count_local + (long)stbtt_ctx * 0x20 + 0x10) =
           *(undefined4 *)(codepoints_count_local + (long)stbtt_ctx * 4);
      end_x = 0;
      end_y = 0;
      char_size = 0;
      local_68 = 0;
      stbtt_GetCodepointBitmapBox
                (_begin_y,*(int *)(dst_count_local + (long)stbtt_ctx * 0x20 + 0x10),
                 (float)codepoints_local[4],(float)codepoints_local[4],&end_x,&end_y,&char_size,
                 &local_68);
      *(float *)(dst_count_local + (long)stbtt_ctx * 0x20 + 8) = (float)(char_size - end_x);
      *(float *)(dst_count_local + (long)stbtt_ctx * 0x20 + 0xc) = (float)(local_68 - end_y);
      *(int *)(dst_count_local + (long)stbtt_ctx * 0x20 + 0x14) = end_x;
      *(int *)(dst_count_local + (long)stbtt_ctx * 0x20 + 0x18) = end_y;
      lVar2 = dst_count_local + (long)stbtt_ctx * 0x20;
      *(int *)(lVar2 + 0x18) =
           (int)((float)codepoints_local[5] * (float)codepoints_local[4]) + *(int *)(lVar2 + 0x18);
      stbtt_GetCodepointHMetrics
                (_begin_y,*(int *)(dst_count_local + (long)stbtt_ctx * 0x20 + 0x10),
                 (int *)(dst_count_local + (long)stbtt_ctx * 0x20 + 0x1c),(int *)0x0);
      lVar2 = dst_count_local + (long)stbtt_ctx * 0x20;
      *(int *)(lVar2 + 0x1c) = (int)((float)*(int *)(lVar2 + 0x1c) * (float)codepoints_local[4]);
      iVar1 = (int)(*(float *)(dst_count_local + (long)stbtt_ctx * 0x20 + 8) *
                   *(float *)(dst_count_local + (long)stbtt_ctx * 0x20 + 0xc));
      if (codepoints_local[3] < iVar1) {
        codepoints_local[3] = iVar1;
      }
    }
  }
  return;
}

Assistant:

RF_API void rf_compute_ttf_font_glyph_metrics(rf_ttf_font_info* font_info, const int* codepoints, rf_int codepoints_count, rf_glyph_info* dst, rf_int dst_count)
{
    if (font_info && font_info->valid)
    {
        if (dst && dst_count >= codepoints_count)
        {
            // The stbtt functions called here should not require any allocations
            RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

            font_info->largest_glyph_size = 0;

            float required_area = 0;

            // NOTE: Using simple packaging, one char after another
            for (rf_int i = 0; i < codepoints_count; i++)
            {
                stbtt_fontinfo* stbtt_ctx = (stbtt_fontinfo*) &font_info->internal_stb_font_info;

                dst[i].codepoint = codepoints[i];

                int begin_x = 0;
                int begin_y = 0;
                int end_x   = 0;
                int end_y   = 0;
                stbtt_GetCodepointBitmapBox(stbtt_ctx, dst[i].codepoint, font_info->scale_factor, font_info->scale_factor, &begin_x, &begin_y, &end_x, &end_y);

                dst[i].width  = end_x - begin_x;
                dst[i].height = end_y - begin_y;
                dst[i].offset_x = begin_x;
                dst[i].offset_y = begin_y;
                dst[i].offset_y += (int) ((float)font_info->ascent * font_info->scale_factor);

                stbtt_GetCodepointHMetrics(stbtt_ctx, dst[i].codepoint, &dst[i].advance_x, NULL);
                dst[i].advance_x *= font_info->scale_factor;

                const int char_size = dst[i].width * dst[i].height;
                if (char_size > font_info->largest_glyph_size) font_info->largest_glyph_size = char_size;
            }
        }
    }
}